

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugstream.cpp
# Opt level: O3

void __thiscall MetaSim::DebugStream::setStream(DebugStream *this,char *filename)

{
  ostream *this_00;
  
  if ((this->_autodelete == true) && (this->_os != (ostream *)0x0)) {
    (**(code **)(*(long *)this->_os + 8))();
  }
  this->_autodelete = true;
  this_00 = (ostream *)operator_new(0x200);
  std::ofstream::ofstream(this_00,filename,_S_out);
  this->_os = this_00;
  return;
}

Assistant:

void DebugStream::setStream(const char *filename)
    {
        if (_autodelete) delete _os;
        _autodelete = true;
        _os = new ofstream(filename); 
    }